

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void loadCPP(pixels *p,string *filename,bool tiled,int fw,int fh,int dwx,int dwy)

{
  Slice *pSVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Vec2 *pVVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  InputFile *this;
  int in_ECX;
  byte in_DL;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int c;
  V2i origin;
  FrameBuffer fb;
  InputFile in;
  undefined1 local_170 [56];
  undefined1 local_138 [60];
  int local_fc;
  undefined1 local_f8 [72];
  undefined1 local_b0 [56];
  Vec2<int> local_78;
  char local_70 [48];
  FrameBuffer local_40;
  long local_8;
  
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = in_DL & 1;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = in_R9D;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = in_R8D;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = in_ECX;
  local_8 = in_RDI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_40,pcVar4,iVar2);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x118c36);
  Imath_3_2::Vec2<int>::Vec2
            (&local_78,(int)local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             in_stack_00000008);
  pVVar5 = (Vec2 *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x118c62);
  lVar6 = (long)(int)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar7 = (ulong)local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_;
  iVar2 = *(int *)(local_8 + 8);
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
  iVar3 = *(int *)(lVar8 + 4);
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
  Imf_3_4::Slice::Make
            ((PixelType)local_b0,(void *)0x0,pVVar5,(long)&local_78,lVar6,uVar7,0,iVar2 << 2,iVar3,
             0.0,SUB41(*(undefined4 *)(lVar8 + 8),0),false);
  Imf_3_4::FrameBuffer::insert(local_70,(Slice *)0x36bf4b);
  pVVar5 = (Vec2 *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x118deb);
  lVar6 = (long)(int)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar7 = (ulong)local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_;
  iVar2 = *(int *)(local_8 + 8);
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
  iVar3 = *(int *)(lVar8 + 4);
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
  Imf_3_4::Slice::Make
            ((PixelType)local_f8,(void *)0x1,pVVar5,(long)&local_78,lVar6,uVar7,0,iVar2 * 2,iVar3,
             0.0,SUB41(*(undefined4 *)(lVar8 + 8),0),false);
  Imf_3_4::FrameBuffer::insert(local_70,(Slice *)0x1a2c01);
  for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
    pSVar1 = (Slice *)channels[local_fc];
    pVVar5 = (Vec2 *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x118faf)
    ;
    lVar6 = (long)(int)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    uVar7 = (ulong)local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_;
    iVar2 = *(int *)(local_8 + 8);
    Imf_3_4::InputFile::header();
    pcVar4 = (char *)Imf_3_4::Header::channels();
    lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
    iVar3 = *(int *)(lVar8 + 4);
    Imf_3_4::InputFile::header();
    pcVar4 = (char *)Imf_3_4::Header::channels();
    lVar8 = Imf_3_4::ChannelList::operator[](pcVar4);
    Imf_3_4::Slice::Make
              ((PixelType)local_138,(void *)0x1,pVVar5,(long)&local_78,lVar6,uVar7,0,iVar2 * 2,iVar3
               ,0.0,SUB41(*(undefined4 *)(lVar8 + 8),0),false);
    Imf_3_4::FrameBuffer::insert(local_70,pSVar1);
  }
  pVVar5 = (Vec2 *)std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x11919e);
  iVar3 = *(int *)(local_8 + 8) << 2;
  this = (InputFile *)(long)iVar3;
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar4);
  iVar2 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar4 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar4);
  Imf_3_4::Slice::Make
            ((PixelType)local_170,(void *)0x2,pVVar5,(long)&local_78,
             (long)(int)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (long)local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,0,iVar3
             ,iVar2,0.0,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert(local_70,(Slice *)0x36bfa5);
  Imf_3_4::InputFile::setFrameBuffer(&local_40);
  Imf_3_4::InputFile::readPixels((int)&local_40,in_stack_00000008);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x119326);
  Imf_3_4::InputFile::~InputFile(this);
  return;
}

Assistant:

static void
loadCPP (
    pixels&            p,
    const std::string& filename,
    bool               tiled,
    int                fw,
    int                fh,
    int                dwx,
    int                dwy)
{
    InputFile in (filename.c_str ());
    {
        FrameBuffer fb;
        V2i         origin{dwx, dwy};
        fb.insert (
            "I",
            Slice::Make (
                IMF::UINT,
                p.i.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["I"].xSampling,
                in.header ().channels ()["I"].ySampling,
                0.0,
                false,
                false));
        fb.insert (
            "H",
            Slice::Make (
                IMF::HALF,
                p.h.data (),
                origin,
                fw,
                fh,
                0,
                2 * p._stride_x,
                in.header ().channels ()["H"].xSampling,
                in.header ().channels ()["H"].ySampling,
                0.0,
                false,
                false));

        for (int c = 0; c < 4; c++)
        {
            fb.insert (
                channels[c],
                Slice::Make (
                    IMF::HALF,
                    p.rgba[c].data (),
                    origin,
                    fw,
                    fh,
                    0,
                    2 * p._stride_x,
                    in.header ().channels ()[channels[c]].xSampling,
                    in.header ().channels ()[channels[c]].ySampling,
                    0.0,
                    false,
                    false));
        }
        fb.insert (
            "F",
            Slice::Make (
                IMF::FLOAT,
                p.f.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["F"].xSampling,
                in.header ().channels ()["F"].ySampling,
                0.0,
                false,
                false));

        in.setFrameBuffer (fb);
        in.readPixels (dwy, dwy + fh - 1);
    }
}